

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O1

int blake2s(void *out,size_t outlen,void *in,size_t inlen,void *key,size_t keylen)

{
  int iVar1;
  blake2s_state S [1];
  blake2s_param local_d8;
  blake2s_state local_b8;
  
  iVar1 = -1;
  if ((out != (void *)0x0) && (in != (void *)0x0 || inlen == 0)) {
    if ((keylen < 0x21) &&
       ((0xffffffffffffffdf < outlen - 0x21 && (key != (void *)0x0 || keylen == 0)))) {
      if (keylen == 0) {
        local_d8.digest_length = (uint8_t)outlen;
        local_d8.key_length = '\0';
        local_d8.fanout = '\x01';
        local_d8.depth = '\x01';
        local_d8.leaf_length = 0;
        local_d8.node_offset = 0;
        local_d8.xof_length = 0;
        local_d8.node_depth = '\0';
        local_d8.inner_length = '\0';
        local_d8.salt[0] = '\0';
        local_d8.salt[1] = '\0';
        local_d8.salt[2] = '\0';
        local_d8.salt[3] = '\0';
        local_d8.salt[4] = '\0';
        local_d8.salt[5] = '\0';
        local_d8.salt[6] = '\0';
        local_d8.salt[7] = '\0';
        local_d8.personal[0] = '\0';
        local_d8.personal[1] = '\0';
        local_d8.personal[2] = '\0';
        local_d8.personal[3] = '\0';
        local_d8.personal[4] = '\0';
        local_d8.personal[5] = '\0';
        local_d8.personal[6] = '\0';
        local_d8.personal[7] = '\0';
        blake2s_init_param(&local_b8,&local_d8);
      }
      else {
        iVar1 = blake2s_init_key(&local_b8,outlen,key,keylen);
        if (iVar1 < 0) {
          return -1;
        }
      }
      blake2s_update(&local_b8,in,inlen);
      blake2s_final(&local_b8,out,outlen);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int blake2s( void *out, size_t outlen, const void *in, size_t inlen, const void *key, size_t keylen )
{
  blake2s_state S[1];

  /* Verify parameters */
  if ( NULL == in && inlen > 0 ) return -1;

  if ( NULL == out ) return -1;

  if ( NULL == key && keylen > 0) return -1;

  if( !outlen || outlen > BLAKE2S_OUTBYTES ) return -1;

  if( keylen > BLAKE2S_KEYBYTES ) return -1;

  if( keylen > 0 )
  {
    if( blake2s_init_key( S, outlen, key, keylen ) < 0 ) return -1;
  }
  else
  {
    if( blake2s_init( S, outlen ) < 0 ) return -1;
  }

  blake2s_update( S, ( const uint8_t * )in, inlen );
  blake2s_final( S, out, outlen );
  return 0;
}